

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O3

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterOfWrongType_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  MyTypeForTesting actualObject;
  MyTypeForTesting expectedObject;
  MockExpectedCallsListForTest expectations;
  MyTypeForTestingCopier copier;
  MockUnexpectedOutputParameterFailure expectedFailure;
  MockNamedValue parameter;
  MockFailureReporterInstaller local_141;
  SimpleString local_140;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  undefined **local_100;
  undefined8 *local_f8;
  undefined **local_f0;
  undefined8 *local_e8;
  MockExpectedCallsList local_e0;
  undefined **local_d0;
  TestFailure local_c8;
  MockNamedValue local_60;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_141);
  local_f0 = &PTR__MyTypeForTesting_002b2490;
  local_e8 = (undefined8 *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                          ,0x2e);
  *local_e8 = 0x1e248;
  local_100 = &PTR__MyTypeForTesting_002b2490;
  local_f8 = (undefined8 *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                          ,0x2e);
  *local_f8 = 0x1277e;
  local_d0 = &PTR__MockNamedValueCopier_002b2ca8;
  SimpleString::SimpleString((SimpleString *)&local_c8,"");
  pMVar2 = mock((SimpleString *)&local_c8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_60,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_60,&local_d0);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  MockExpectedCallsList::MockExpectedCallsList(&local_e0);
  local_e0._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&local_c8,"foo");
  pMVar3 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_e0,(SimpleString *)&local_c8);
  SimpleString::SimpleString((SimpleString *)&local_60,"MyTypeForTesting");
  SimpleString::SimpleString(&local_140,"output");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[7])
            (pMVar3,&local_60,&local_140,&local_f0);
  SimpleString::~SimpleString(&local_140);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  SimpleString::SimpleString((SimpleString *)&local_c8,"output");
  MockNamedValue::MockNamedValue(&local_60,(SimpleString *)&local_c8);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  SimpleString::SimpleString((SimpleString *)&local_c8,"OtherTypeForTesting");
  MockNamedValue::setConstObjectPointer(&local_60,(SimpleString *)&local_c8,&local_100);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_140,"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)&local_c8,test,&local_140,&local_60,&local_e0);
  SimpleString::~SimpleString(&local_140);
  SimpleString::SimpleString(&local_140,"");
  pMVar2 = mock(&local_140,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_110,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_110);
  SimpleString::SimpleString(&local_120,"MyTypeForTesting");
  SimpleString::SimpleString(&local_130,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_120,&local_130,&local_f0);
  SimpleString::~SimpleString(&local_130);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_140);
  SimpleString::SimpleString(&local_140,"");
  pMVar2 = mock(&local_140,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_110,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_110);
  SimpleString::SimpleString(&local_120,"OtherTypeForTesting");
  SimpleString::SimpleString(&local_130,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_120,&local_130,&local_100);
  SimpleString::~SimpleString(&local_130);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_140);
  SimpleString::SimpleString(&local_140,"");
  pMVar2 = mock(&local_140,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_140);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x106);
  SimpleString::SimpleString(&local_140,"");
  pMVar2 = mock(&local_140,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_140);
  TestFailure::~TestFailure(&local_c8);
  MockNamedValue::~MockNamedValue(&local_60);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_e0);
  local_100 = &PTR__MyTypeForTesting_002b2490;
  operator_delete(local_f8,8);
  local_f0 = &PTR__MyTypeForTesting_002b2490;
  operator_delete(local_e8,8);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_141);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterOfWrongType)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(123464);
    MyTypeForTesting actualObject(75646);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockNamedValue parameter("output");
    parameter.setConstObjectPointer("OtherTypeForTesting", &actualObject);
    MockUnexpectedOutputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().actualCall("foo").withOutputParameterOfType("OtherTypeForTesting", "output", &actualObject);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}